

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture1DArray_GL.cpp
# Opt level: O1

void __thiscall
Diligent::Texture1DArray_GL::Texture1DArray_GL
          (Texture1DArray_GL *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *TexViewObjAllocator,RenderDeviceGLImpl *pDeviceGL,
          GLContextState *GLState,TextureDesc *TexDesc,TextureData *pInitData,bool bIsDeviceInternal
          )

{
  GLTextureObj *TexObj;
  uint uVar1;
  uint uVar2;
  Uint32 Slice;
  Uint32 MipLevel;
  GLenum local_5c;
  GLenum err;
  GLTextureCreateReleaseHelper GStack_54;
  ulong local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper> *local_38;
  
  TextureBaseGL::TextureBaseGL
            (&this->super_TextureBaseGL,pRefCounters,TexViewObjAllocator,pDeviceGL,TexDesc,0x8c18,
             pInitData,bIsDeviceInternal);
  (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>.
  super_ObjectBase<Diligent::ITextureGL>.super_RefCountedObject<Diligent::ITextureGL>.
  super_ITextureGL.super_ITexture = (ITexture)&PTR_QueryInterface_00b06140;
  if (TexDesc->Usage != USAGE_STAGING) {
    TexObj = &(this->super_TextureBaseGL).m_GlTexture;
    GLContextState::BindTexture(GLState,-1,(this->super_TextureBaseGL).m_BindTarget,TexObj);
    (*__glewTexStorage2D)
              ((this->super_TextureBaseGL).m_BindTarget,
               (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
               super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
               .m_Desc.MipLevels,(this->super_TextureBaseGL).m_GLTexFormat,
               (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
               super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
               .m_Desc.Width,
               (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
               super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
               .m_Desc.field_3.ArraySize);
    err = glGetError();
    if (err != 0) {
      LogError<true,char[52],char[17],unsigned_int>
                (false,"Texture1DArray_GL",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture1DArray_GL.cpp"
                 ,0x45,(char (*) [52])"Failed to allocate storage for the 1D texture array",
                 (char (*) [17])"\nGL Error Code: ",&err);
    }
    TextureBaseGL::SetDefaultGLParameters(&this->super_TextureBaseGL);
    local_38 = TexObj;
    if ((pInitData != (TextureData *)0x0) && (pInitData->pSubResources != (TextureSubResData *)0x0))
    {
      if ((this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
          super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
          .m_Desc.field_3.ArraySize *
          (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
          super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
          .m_Desc.MipLevels == pInitData->NumSubresources) {
        if ((this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
            super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
            .m_Desc.field_3.ArraySize != 0) {
          Slice = 0;
          do {
            uVar1 = (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                    super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                    .m_Desc.MipLevels;
            if (uVar1 != 0) {
              MipLevel = 0;
              do {
                uVar2 = (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                        super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                        .m_Desc.Width >> ((byte)MipLevel & 0x1f);
                _err = (pointer)((ulong)(uVar2 + (uVar2 == 0)) << 0x20);
                local_50 = 0x100000000;
                aStack_48._M_allocated_capacity = 0x100000000;
                UpdateData(this,GLState,MipLevel,Slice,(Box *)&err,
                           pInitData->pSubResources + (uVar1 * Slice + MipLevel));
                MipLevel = MipLevel + 1;
                uVar1 = (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                        super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                        .m_Desc.MipLevels;
              } while (MipLevel < uVar1);
            }
            Slice = Slice + 1;
          } while (Slice < (this->super_TextureBaseGL).
                           super_TextureBase<Diligent::EngineGLImplTraits>.
                           super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                           .m_Desc.field_3.ArraySize);
        }
      }
      else {
        FormatString<char[33]>((string *)&err,(char (*) [33])"Incorrect number of subresources");
        DebugAssertionFailed
                  (_err,"Texture1DArray_GL",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture1DArray_GL.cpp"
                   ,99);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_err != &aStack_48) {
          operator_delete(_err,aStack_48._M_allocated_capacity + 1);
        }
      }
    }
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::SetName
              (local_38,(this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                        super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                        .m_Desc.super_DeviceObjectAttribs.Name);
    _err = (pointer)0x0;
    local_50 = local_50 & 0xffffffff00000000;
    GLContextState::BindTexture
              (GLState,-1,(this->super_TextureBaseGL).m_BindTarget,(GLTextureObj *)&err);
    if (err != 0) {
      local_5c = err;
      if (GStack_54.m_ExternalGLTextureHandle == 0) {
        glDeleteTextures(1,&local_5c);
      }
    }
  }
  return;
}

Assistant:

Texture1DArray_GL::Texture1DArray_GL(IReferenceCounters*        pRefCounters,
                                     FixedBlockMemoryAllocator& TexViewObjAllocator,
                                     RenderDeviceGLImpl*        pDeviceGL,
                                     GLContextState&            GLState,
                                     const TextureDesc&         TexDesc,
                                     const TextureData*         pInitData /*= nullptr*/,
                                     bool                       bIsDeviceInternal /*= false*/) :
    // clang-format off
    TextureBaseGL
    {
        pRefCounters,
        TexViewObjAllocator,
        pDeviceGL,
        TexDesc,
        GL_TEXTURE_1D_ARRAY,
        pInitData,
        bIsDeviceInternal
    }
// clang-format on
{
    if (TexDesc.Usage == USAGE_STAGING)
    {
        // We will use PBO initialized by TextureBaseGL
        return;
    }

    GLState.BindTexture(-1, m_BindTarget, m_GlTexture);

    //                             levels             format          width             height
    glTexStorage2D(m_BindTarget, m_Desc.MipLevels, m_GLTexFormat, m_Desc.Width, m_Desc.ArraySize);
    DEV_CHECK_GL_ERROR_AND_THROW("Failed to allocate storage for the 1D texture array");
    // When target is GL_TEXTURE_1D_ARRAY, calling glTexStorage2D() is equivalent to the following code:
    //for (i = 0; i < levels; i++)
    //{
    //    glTexImage2D(target, i, internalformat, width, height, 0, format, type, NULL);
    //    width = max(1, (width / 2));
    //}

    SetDefaultGLParameters();

    if (pInitData != nullptr && pInitData->pSubResources != nullptr)
    {
        if (m_Desc.MipLevels * m_Desc.ArraySize == pInitData->NumSubresources)
        {
            for (Uint32 Slice = 0; Slice < m_Desc.ArraySize; ++Slice)
            {
                for (Uint32 Mip = 0; Mip < m_Desc.MipLevels; ++Mip)
                {
                    Box DstBox{0, std::max(m_Desc.Width >> Mip, 1U),
                               0, 1};
                    // UpdateData() is a virtual function. If we try to call it through vtbl from here,
                    // we will get into TextureBaseGL::UpdateData(), because instance of Texture1DArray_GL
                    // is not fully constructed yet.
                    // To call the required function, we need to explicitly specify the class:
                    Texture1DArray_GL::UpdateData(GLState, Mip, Slice, DstBox, pInitData->pSubResources[Slice * m_Desc.MipLevels + Mip]);
                }
            }
        }
        else
        {
            UNEXPECTED("Incorrect number of subresources");
        }
    }

    m_GlTexture.SetName(m_Desc.Name);

    GLState.BindTexture(-1, m_BindTarget, GLObjectWrappers::GLTextureObj::Null());
}